

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O0

void __thiscall TokenPoolTestTwoTokens::~TokenPoolTestTwoTokens(TokenPoolTestTwoTokens *this)

{
  TokenPoolTestTwoTokens *this_local;
  
  ~TokenPoolTestTwoTokens(this);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(TokenPoolTest, TwoTokens) {
  CreateDefaultPool();

  ASSERT_NE(NULL, tokens_);
  EXPECT_EQ(kLoadAverageDefault, load_avg_);

  // implicit token
  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());

  // jobserver offers 2nd token
#ifdef _WIN32
  LONG previous;
  ASSERT_TRUE(ReleaseSemaphore(semaphore_, 1, &previous));
  ASSERT_EQ(0, previous);
#else
  ASSERT_EQ(1u, write(fds_[1], "T", 1));
#endif
  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());

  // release 2nd token
  tokens_->Release();
  EXPECT_TRUE(tokens_->Acquire());

  // release implict token - must return 2nd token back to jobserver
  tokens_->Release();
  EXPECT_TRUE(tokens_->Acquire());

  // there must be one token available
#ifdef _WIN32
  EXPECT_EQ(WAIT_OBJECT_0, WaitForSingleObject(semaphore_, 0));
  EXPECT_TRUE(ReleaseSemaphore(semaphore_, 1, &previous));
  EXPECT_EQ(0, previous);
#else
  EXPECT_EQ(1u, read(fds_[0], buf_, sizeof(buf_)));
#endif

  // implicit token
  EXPECT_TRUE(tokens_->Acquire());
}